

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O3

Offset<const_flatbuffers::Table_*>
flatbuffers::CopyTable
          (FlatBufferBuilder *fbb,Schema *schema,Object *objectdef,Table *table,
          bool use_string_pooling)

{
  uint *puVar1;
  uint8_t **ppuVar2;
  Table *pTVar3;
  Field FVar4;
  Object OVar5;
  FlatBufferBuilder *pFVar6;
  voffset_t field;
  uint uVar7;
  Offset<const_flatbuffers::Table_*> OVar8;
  Offset<flatbuffers::String> OVar9;
  int iVar10;
  uoffset_t uVar11;
  long lVar12;
  Object *pOVar13;
  Field *pFVar14;
  ushort uVar15;
  long lVar16;
  long lVar17;
  Field *pFVar18;
  uint8_t *offset_location;
  Object *pOVar19;
  Table *pTVar20;
  pointer pOVar21;
  ulong uVar22;
  ushort uVar23;
  uint8_t *__dest;
  long lVar24;
  Schema *pSVar25;
  Schema *pSVar26;
  undefined7 in_register_00000081;
  long lVar27;
  size_t sVar28;
  unsigned_short vtsize_15;
  Object *pOVar29;
  size_t sVar30;
  ulong uVar31;
  long lVar32;
  uoffset_t offset;
  vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
  elements;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsets;
  uint local_a4;
  uint local_a0;
  allocator_type local_99;
  Table *local_98;
  FlatBufferBuilder *local_90;
  Schema *local_88;
  vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
  local_80;
  void *local_68;
  iterator iStack_60;
  uint *local_58;
  Table *local_48;
  Object *local_40;
  Object *local_38;
  
  local_a0 = (uint)CONCAT71(in_register_00000081,use_string_pooling);
  local_68 = (void *)0x0;
  iStack_60._M_current = (uint *)0x0;
  local_58 = (uint *)0x0;
  lVar16 = -(long)*(int *)objectdef;
  if ((*(ushort *)(objectdef + -(long)*(int *)objectdef) < 7) ||
     (uVar22 = (ulong)*(ushort *)(objectdef + lVar16 + 6), uVar22 == 0)) {
    pOVar29 = (Object *)0x0;
  }
  else {
    pOVar29 = objectdef + *(uint *)(objectdef + uVar22) + uVar22;
  }
  pOVar19 = pOVar29 + 4;
  uVar7 = *(uint *)pOVar29;
  local_90 = fbb;
  local_88 = schema;
  local_40 = pOVar19;
  pOVar13 = objectdef;
  if ((uVar7 & 0x3fffffff) != 0) {
    do {
      local_38 = pOVar13;
      pFVar14 = (Field *)(pOVar19 + *(uint *)pOVar19);
      if ((*(ushort *)(pFVar14 + -(long)*(int *)(pOVar19 + *(uint *)pOVar19)) < 0xb) ||
         ((ulong)*(ushort *)(pFVar14 + (10 - (long)*(int *)(pOVar19 + *(uint *)pOVar19))) == 0)) {
        uVar15 = 0;
      }
      else {
        uVar15 = *(ushort *)
                  (pFVar14 +
                  *(ushort *)(pFVar14 + (10 - (long)*(int *)(pOVar19 + *(uint *)pOVar19))));
      }
      lVar16 = (long)*(int *)table;
      uVar23 = *(ushort *)(table + -lVar16);
      uVar22 = (ulong)uVar23;
      if ((uVar15 < uVar23) && (*(short *)(table + ((ulong)uVar15 - lVar16)) != 0)) {
        local_a4 = 0;
        lVar12 = -(long)*(int *)pFVar14;
        uVar15 = *(ushort *)(pFVar14 + -(long)*(int *)pFVar14);
        if ((uVar15 < 7) || (uVar31 = (ulong)*(ushort *)(pFVar14 + lVar12 + 6), uVar31 == 0)) {
          pFVar18 = (Field *)0x0;
        }
        else {
          pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar31) + uVar31;
        }
        OVar8.o = local_a4;
        if ((4 < *(ushort *)(pFVar18 + -(long)*(int *)pFVar18)) &&
           ((ulong)*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18)) != 0)) {
          switch(pFVar18[*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18))].super_Table) {
          case (Table)0xd:
            if ((bool)(char)local_a0 == false) {
              if ((uVar15 < 7) || (uVar31 = (ulong)*(ushort *)(pFVar14 + lVar12 + 6), uVar31 == 0))
              {
                pFVar18 = (Field *)0x0;
              }
              else {
                pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar31) + uVar31;
              }
              if (((*(ushort *)(pFVar18 + -(long)*(int *)pFVar18) < 5) ||
                  ((ulong)*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18)) == 0)) ||
                 (pFVar18[*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18))].super_Table !=
                  (Table)0xd)) goto LAB_0014a355;
              if ((10 < uVar15) && ((ulong)*(ushort *)(pFVar14 + lVar12 + 10) != 0)) {
                OVar8.o = 0;
                if ((uVar23 <= *(ushort *)(pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10))) ||
                   (uVar22 = (ulong)*(ushort *)
                                     (table + ((ulong)*(ushort *)
                                                       (pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10)
                                                       ) - lVar16)),
                   *(ushort *)
                    (table + ((ulong)*(ushort *)(pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10)) -
                             lVar16)) == 0)) break;
              }
              FlatBufferBuilderImpl<false>::CreateStringImpl
                        (fbb,(char *)(table + *(uint *)(table + uVar22) + uVar22 + 4),
                         (ulong)*(uint *)(table + *(uint *)(table + uVar22) + uVar22));
              OVar8.o = (fbb->buf_).size_;
            }
            else {
              if ((uVar15 < 7) || (uVar31 = (ulong)*(ushort *)(pFVar14 + lVar12 + 6), uVar31 == 0))
              {
                pFVar18 = (Field *)0x0;
              }
              else {
                pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar31) + uVar31;
              }
              if (((*(ushort *)(pFVar18 + -(long)*(int *)pFVar18) < 5) ||
                  ((ulong)*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18)) == 0)) ||
                 (pFVar18[*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18))].super_Table !=
                  (Table)0xd)) {
LAB_0014a355:
                __assert_fail("field.type()->base_type() == reflection::String",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/reflection.h"
                              ,0x8b,
                              "const String *flatbuffers::GetFieldS(const Table &, const reflection::Field &)"
                             );
              }
              if ((10 < uVar15) && ((ulong)*(ushort *)(pFVar14 + lVar12 + 10) != 0)) {
                OVar8.o = 0;
                if ((uVar23 <= *(ushort *)(pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10))) ||
                   (uVar22 = (ulong)*(ushort *)
                                     (table + ((ulong)*(ushort *)
                                                       (pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10)
                                                       ) - lVar16)),
                   *(ushort *)
                    (table + ((ulong)*(ushort *)(pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10)) -
                             lVar16)) == 0)) break;
              }
              OVar8.o = (offset_type)
                        FlatBufferBuilderImpl<false>::CreateSharedString
                                  (fbb,(char *)(table + *(uint *)(table + uVar22) + uVar22 + 4),
                                   (ulong)*(uint *)(table + *(uint *)(table + uVar22) + uVar22));
            }
            break;
          case (Table)0xe:
            if (uVar15 < 0xb) {
              local_98 = table + (ulong)*(uint *)(table + uVar23) + (ulong)uVar23;
              if (6 < uVar15) goto LAB_00149bf6;
LAB_00149c0f:
              pFVar18 = (Field *)0x0;
            }
            else {
              if (((ulong)*(ushort *)(pFVar14 + lVar12 + 10) == 0) ||
                 ((*(ushort *)(pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10)) < uVar23 &&
                  (uVar22 = (ulong)*(ushort *)
                                    (table + ((ulong)*(ushort *)
                                                      (pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10))
                                             - lVar16)),
                  *(ushort *)
                   (table + ((ulong)*(ushort *)(pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10)) -
                            lVar16)) != 0)))) {
                local_98 = table + *(uint *)(table + uVar22) + uVar22;
              }
              else {
                local_98 = (Table *)0x0;
              }
LAB_00149bf6:
              uVar22 = (ulong)*(ushort *)(pFVar14 + lVar12 + 6);
              if (uVar22 == 0) goto LAB_00149c0f;
              pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar22) + uVar22;
            }
            pTVar3 = local_98;
            if ((*(ushort *)(pFVar18 + -(long)*(int *)pFVar18) < 7) ||
               ((ulong)*(ushort *)(pFVar18 + (6 - (long)*(int *)pFVar18)) == 0)) {
              uVar7 = 0;
LAB_00149c7d:
              sVar28 = (&GetTypeSize(reflection::BaseType)::sizes)[uVar7];
              sVar30 = sVar28;
LAB_00149c8d:
              FlatBufferBuilderImpl<false>::StartVector<flatbuffers::Offset,unsigned_int>
                        (fbb,(ulong)*(uint *)local_98,sVar30,sVar28);
              sVar28 = (size_t)*(uint *)pTVar3;
              sVar30 = sVar30 * sVar28;
              if (sVar30 != 0) {
                vector_downward<unsigned_int>::ensure_space(&fbb->buf_,sVar30);
                pTVar3 = local_98;
                __dest = (fbb->buf_).cur_ + -sVar30;
                (fbb->buf_).cur_ = __dest;
                puVar1 = &(fbb->buf_).size_;
                *puVar1 = *puVar1 + (int)sVar30;
                memcpy(__dest,local_98 + 4,sVar30);
                sVar28 = (size_t)*(uint *)pTVar3;
              }
              OVar8.o = FlatBufferBuilderImpl<false>::EndVector<unsigned_int,unsigned_int>
                                  (fbb,sVar28);
            }
            else {
              FVar4.super_Table =
                   pFVar18[*(ushort *)(pFVar18 + (6 - (long)*(int *)pFVar18))].super_Table;
              if (FVar4.super_Table == (Table)0xd) {
                std::
                vector<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                ::vector(&local_80,(ulong)*(uint *)local_98,&local_99);
                if (*(uint *)pTVar3 != 0) {
                  local_48 = local_98 + 4;
                  uVar31 = 0;
                  uVar22 = 0;
                  do {
                    pFVar6 = local_90;
                    pTVar3 = local_48 +
                             (ulong)*(uint *)(local_48 + (uVar31 & 0xffffffff)) +
                             (uVar31 & 0xffffffff);
                    if ((char)local_a0 == '\0') {
                      FlatBufferBuilderImpl<false>::CreateStringImpl
                                (local_90,(char *)(pTVar3 + 4),(ulong)*(uint *)pTVar3);
                      OVar9.o = (pFVar6->buf_).size_;
                    }
                    else {
                      OVar9 = FlatBufferBuilderImpl<false>::CreateSharedString
                                        (local_90,(char *)(pTVar3 + 4),(ulong)*(uint *)pTVar3);
                    }
                    *(offset_type *)
                     ((long)&(local_80.
                              super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->o + uVar31) = OVar9.o;
                    uVar22 = uVar22 + 1;
                    uVar31 = uVar31 + 4;
                  } while (uVar22 < *(uint *)local_98);
                }
                fbb = local_90;
                pOVar21 = local_80.
                          super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_80.
                          super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_80.
                          super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0) {
                  pOVar21 = (pointer)&data<flatbuffers::Offset<flatbuffers::String_const*>,std::allocator<flatbuffers::Offset<flatbuffers::String_const*>>>(std::vector<flatbuffers::Offset<flatbuffers::String_const*>,std::allocator<flatbuffers::Offset<flatbuffers::String_const*>>>const&)
                                      ::t;
                }
                local_a4 = (uint)FlatBufferBuilderImpl<false>::
                                 CreateVector<flatbuffers::String_const*>
                                           (local_90,pOVar21,
                                            (long)local_80.
                                                  super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_80.
                                                  super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2);
              }
              else {
                if (FVar4.super_Table != (Table)0xf) {
                  uVar7 = (uint)(char)FVar4.super_Table;
                  goto LAB_00149c7d;
                }
                if ((*(ushort *)(local_88 + -(long)*(int *)local_88) < 5) ||
                   (uVar22 = (ulong)*(ushort *)(local_88 + (4 - (long)*(int *)local_88)),
                   uVar22 == 0)) {
                  pSVar25 = (Schema *)0x0;
                }
                else {
                  pSVar25 = local_88 + *(uint *)(local_88 + uVar22) + uVar22;
                }
                if ((uVar15 < 7) || (uVar22 = (ulong)*(ushort *)(pFVar14 + lVar12 + 6), uVar22 == 0)
                   ) {
                  pFVar14 = (Field *)0x0;
                }
                else {
                  pFVar14 = pFVar14 + *(uint *)(pFVar14 + uVar22) + uVar22;
                }
                if (((*(ushort *)(pFVar14 + -(long)*(int *)pFVar14) < 9) ||
                    ((ulong)*(ushort *)(pFVar14 + (8 - (long)*(int *)pFVar14)) == 0)) ||
                   (*(uint *)pSVar25 <=
                    *(uint *)(pFVar14 + *(ushort *)(pFVar14 + (8 - (long)*(int *)pFVar14)))))
                goto LAB_0014a317;
                uVar22 = (ulong)(*(uint *)(pFVar14 +
                                          *(ushort *)(pFVar14 + (8 - (long)*(int *)pFVar14))) << 2);
                lVar16 = *(uint *)(pSVar25 + uVar22 + 4) + uVar22;
                pTVar20 = &pSVar25[lVar16 + 4].super_Table;
                if (8 < *(ushort *)(pTVar20 + -(long)(int)*(uint *)pTVar20)) {
                  lVar12 = -(long)(int)*(uint *)pTVar20;
                  if (((ulong)*(ushort *)(pSVar25 + lVar12 + lVar16 + 0xc) != 0) &&
                     (pTVar20[*(ushort *)(pSVar25 + lVar12 + lVar16 + 0xc)] != (Table)0x0)) {
                    sVar28 = DAT_0016c428;
                    if ((*(ushort *)(pTVar20 + -(long)(int)*(uint *)pTVar20) < 0xd) ||
                       ((ulong)*(ushort *)(pSVar25 + lVar12 + lVar16 + 0x10) == 0)) {
                      sVar30 = 0;
                    }
                    else {
                      sVar30 = (long)*(int *)(pTVar20 +
                                             *(ushort *)(pSVar25 + lVar12 + lVar16 + 0x10));
                    }
                    goto LAB_00149c8d;
                  }
                }
                local_48 = pTVar20;
                std::
                vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                ::vector((vector<flatbuffers::Offset<const_flatbuffers::Table_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::Table_*>_>_>
                          *)&local_80,(ulong)*(uint *)local_98,(allocator_type *)&local_99);
                pTVar20 = local_98;
                if (*(uint *)pTVar3 != 0) {
                  uVar31 = 0;
                  uVar22 = 0;
                  do {
                    OVar8 = CopyTable(local_90,local_88,(Object *)local_48,
                                      pTVar20 + (ulong)*(uint *)(pTVar20 + (uVar31 & 0xffffffff) + 4
                                                                ) + (uVar31 & 0xffffffff) + 4,
                                      (bool)(char)local_a0);
                    *(offset_type *)
                     ((long)&(local_80.
                              super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->o + uVar31) = OVar8.o;
                    uVar22 = uVar22 + 1;
                    uVar31 = uVar31 + 4;
                  } while (uVar22 < *(uint *)local_98);
                }
                fbb = local_90;
                pOVar21 = local_80.
                          super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if ((long)local_80.
                          super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_80.
                          super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start == 0) {
                  pOVar21 = (pointer)&data<flatbuffers::Offset<flatbuffers::Table_const*>,std::allocator<flatbuffers::Offset<flatbuffers::Table_const*>>>(std::vector<flatbuffers::Offset<flatbuffers::Table_const*>,std::allocator<flatbuffers::Offset<flatbuffers::Table_const*>>>const&)
                                      ::t;
                }
                local_a4 = (uint)FlatBufferBuilderImpl<false>::
                                 CreateVector<flatbuffers::Table_const*>
                                           (local_90,(Offset<const_flatbuffers::Table_*> *)pOVar21,
                                            (long)local_80.
                                                  super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_80.
                                                  super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2);
              }
              OVar8.o = local_a4;
              if (local_80.
                  super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  (Offset<const_flatbuffers::String_*> *)0x0) {
                operator_delete(local_80.
                                super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_80.
                                      super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_80.
                                      super__Vector_base<flatbuffers::Offset<const_flatbuffers::String_*>,_std::allocator<flatbuffers::Offset<const_flatbuffers::String_*>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                OVar8.o = local_a4;
              }
            }
            break;
          case (Table)0xf:
            if ((*(ushort *)(local_88 + -(long)*(int *)local_88) < 5) ||
               (uVar31 = (ulong)*(ushort *)(local_88 + (4 - (long)*(int *)local_88)), uVar31 == 0))
            {
              pSVar25 = (Schema *)0x0;
            }
            else {
              pSVar25 = local_88 + *(uint *)(local_88 + uVar31) + uVar31;
            }
            if ((uVar15 < 7) || (uVar31 = (ulong)*(ushort *)(pFVar14 + lVar12 + 6), uVar31 == 0)) {
              pFVar18 = (Field *)0x0;
            }
            else {
              pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar31) + uVar31;
            }
            if (((*(ushort *)(pFVar18 + -(long)*(int *)pFVar18) < 9) ||
                ((ulong)*(ushort *)(pFVar18 + (8 - (long)*(int *)pFVar18)) == 0)) ||
               (*(uint *)pSVar25 <=
                *(uint *)(pFVar18 + *(ushort *)(pFVar18 + (8 - (long)*(int *)pFVar18)))))
            goto LAB_0014a317;
            uVar31 = (ulong)(*(uint *)(pFVar18 + *(ushort *)(pFVar18 + (8 - (long)*(int *)pFVar18)))
                            << 2);
            lVar32 = *(uint *)(pSVar25 + uVar31 + 4) + uVar31;
            pOVar13 = (Object *)(pSVar25 + lVar32 + 4);
            if (((*(ushort *)(pOVar13 + -(long)*(int *)pOVar13) < 9) ||
                ((ulong)*(ushort *)(pSVar25 + ((lVar32 + 0xc) - (long)*(int *)pOVar13)) == 0)) ||
               (pOVar13[*(ushort *)(pSVar25 + ((lVar32 + 0xc) - (long)*(int *)pOVar13))].super_Table
                == (Table)0x0)) {
              if ((uVar15 < 7) || (uVar31 = (ulong)*(ushort *)(pFVar14 + lVar12 + 6), uVar31 == 0))
              {
                pFVar18 = (Field *)0x0;
              }
              else {
                pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar31) + uVar31;
              }
              if (((*(ushort *)(pFVar18 + -(long)*(int *)pFVar18) < 5) ||
                  ((ulong)*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18)) == 0)) ||
                 (pFVar18[*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18))].super_Table !=
                  (Table)0xf)) {
                if ((uVar15 < 7) || (uVar31 = (ulong)*(ushort *)(pFVar14 + lVar12 + 6), uVar31 == 0)
                   ) {
                  pFVar18 = (Field *)0x0;
                }
                else {
                  pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar31) + uVar31;
                }
                if (((*(ushort *)(pFVar18 + -(long)*(int *)pFVar18) < 5) ||
                    ((ulong)*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18)) == 0)) ||
                   (pFVar18[*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18))].super_Table !=
                    (Table)0x10)) goto LAB_0014a336;
              }
              if ((10 < uVar15) && ((ulong)*(ushort *)(pFVar14 + lVar12 + 10) != 0)) {
                uVar22 = (ulong)*(ushort *)
                                 (table + ((ulong)*(ushort *)
                                                   (pFVar14 + *(ushort *)(pFVar14 + lVar12 + 10)) -
                                          lVar16));
              }
              OVar8 = CopyTable(fbb,local_88,pOVar13,table + *(uint *)(table + uVar22) + uVar22,
                                (bool)(char)local_a0);
            }
            break;
          case (Table)0x10:
            pOVar13 = GetUnionType(local_88,local_38,pFVar14,table);
            lVar16 = -(long)*(int *)pFVar14;
            uVar15 = *(ushort *)(pFVar14 + -(long)*(int *)pFVar14);
            if ((uVar15 < 7) || (uVar22 = (ulong)*(ushort *)(pFVar14 + lVar16 + 6), uVar22 == 0)) {
              pFVar18 = (Field *)0x0;
            }
            else {
              pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar22) + uVar22;
            }
            if (((*(ushort *)(pFVar18 + -(long)*(int *)pFVar18) < 5) ||
                ((ulong)*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18)) == 0)) ||
               (pFVar18[*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18))].super_Table !=
                (Table)0xf)) {
              if ((uVar15 < 7) || (uVar22 = (ulong)*(ushort *)(pFVar14 + lVar16 + 6), uVar22 == 0))
              {
                pFVar18 = (Field *)0x0;
              }
              else {
                pFVar18 = pFVar14 + *(uint *)(pFVar14 + uVar22) + uVar22;
              }
              if (((*(ushort *)(pFVar18 + -(long)*(int *)pFVar18) < 5) ||
                  ((ulong)*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18)) == 0)) ||
                 (pFVar18[*(ushort *)(pFVar18 + (4 - (long)*(int *)pFVar18))].super_Table !=
                  (Table)0x10)) {
LAB_0014a336:
                __assert_fail("field.type()->base_type() == reflection::Obj || field.type()->base_type() == reflection::Union"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/reflection.h"
                              ,0xa2,
                              "Table *flatbuffers::GetFieldT(const Table &, const reflection::Field &)"
                             );
              }
            }
            if ((uVar15 < 0xb) || ((ulong)*(ushort *)(pFVar14 + lVar16 + 10) == 0)) {
              uVar15 = 0;
            }
            else {
              uVar15 = *(ushort *)(pFVar14 + *(ushort *)(pFVar14 + lVar16 + 10));
            }
            OVar8 = CopyTable(fbb,local_88,pOVar13,
                              table + (ulong)*(uint *)(table + *(ushort *)
                                                                (table + ((ulong)uVar15 -
                                                                         (long)*(int *)table))) +
                                      (ulong)*(ushort *)
                                              (table + ((ulong)uVar15 - (long)*(int *)table)),
                              (bool)(char)local_a0);
          }
        }
        local_a4 = OVar8.o;
        if (local_a4 != 0) {
          if (iStack_60._M_current == local_58) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                       &local_a4);
          }
          else {
            *iStack_60._M_current = local_a4;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
        uVar7 = *(uint *)pOVar29;
      }
      pOVar19 = pOVar19 + 4;
      pOVar13 = local_38;
    } while (pOVar19 != local_40 + uVar7 * 4);
    lVar16 = -(long)*(int *)local_38;
    objectdef = local_38;
  }
  if (((*(ushort *)(objectdef + lVar16) < 9) || ((ulong)*(ushort *)(objectdef + lVar16 + 8) == 0))
     || (objectdef[*(ushort *)(objectdef + lVar16 + 8)].super_Table == (Table)0x0)) {
    FlatBufferBuilderImpl<false>::NotNested(fbb);
    fbb->nested = true;
  }
  else {
    if ((*(ushort *)(objectdef + lVar16) < 0xb) ||
       ((ulong)*(ushort *)(objectdef + lVar16 + 10) == 0)) {
      uVar22 = 0;
    }
    else {
      uVar22 = (ulong)*(int *)(objectdef + *(ushort *)(objectdef + lVar16 + 10));
      if (fbb->minalign_ < uVar22) {
        fbb->minalign_ = uVar22;
      }
    }
    vector_downward<unsigned_int>::fill(&fbb->buf_,uVar22 - 1 & -(ulong)(fbb->buf_).size_);
  }
  local_a0 = (fbb->buf_).size_;
  if ((*(uint *)pOVar29 & 0x3fffffff) == 0) {
    lVar16 = 0;
  }
  else {
    lVar32 = 4;
    lVar12 = 10;
    lVar16 = 0;
    do {
      uVar22 = (ulong)*(uint *)(pOVar29 + lVar32);
      lVar17 = uVar22 - (long)*(int *)(pOVar29 + uVar22 + lVar32);
      uVar15 = *(ushort *)(pOVar29 + lVar12 + -6 + lVar17);
      if ((uVar15 < 0xb) || ((ulong)*(ushort *)(pOVar29 + lVar12 + 4 + lVar17) == 0)) {
        uVar23 = 0;
      }
      else {
        uVar23 = *(ushort *)(pOVar29 + lVar32 + *(ushort *)(pOVar29 + lVar12 + 4 + lVar17) + uVar22)
        ;
      }
      if ((uVar23 < *(ushort *)(table + -(long)*(int *)table)) &&
         (*(short *)(table + ((ulong)uVar23 - (long)*(int *)table)) != 0)) {
        if ((uVar15 < 7) || ((ulong)*(ushort *)(pOVar29 + lVar12 + lVar17) == 0)) {
          pOVar19 = (Object *)0x0;
        }
        else {
          lVar24 = *(ushort *)(pOVar29 + lVar12 + lVar17) + uVar22;
          pOVar19 = pOVar29 + (ulong)*(uint *)(pOVar29 + lVar32 + lVar24) + lVar24 + lVar32;
        }
        if ((*(ushort *)(pOVar19 + -(long)*(int *)pOVar19) < 5) ||
           ((ulong)*(ushort *)(pOVar19 + (4 - (long)*(int *)pOVar19)) == 0)) {
          uVar7 = 0;
LAB_0014a0cd:
          anon_unknown_101::CopyInline
                    (local_90,(Field *)(pOVar29 + uVar22 + lVar32),table,
                     (&GetTypeSize(reflection::BaseType)::sizes)[uVar7],
                     (&GetTypeSize(reflection::BaseType)::sizes)[uVar7]);
        }
        else {
          OVar5.super_Table =
               pOVar19[*(ushort *)(pOVar19 + (4 - (long)*(int *)pOVar19))].super_Table;
          if (1 < (byte)OVar5.super_Table - 0xd) {
            if (OVar5.super_Table == (Table)0xf) {
              if ((*(ushort *)(local_88 + -(long)*(int *)local_88) < 5) ||
                 (uVar31 = (ulong)*(ushort *)(local_88 + (4 - (long)*(int *)local_88)), uVar31 == 0)
                 ) {
                pSVar25 = (Schema *)0x0;
              }
              else {
                pSVar25 = local_88 + *(uint *)(local_88 + uVar31) + uVar31;
              }
              if ((uVar15 < 7) || ((ulong)*(ushort *)(pOVar29 + lVar12 + lVar17) == 0)) {
                pOVar19 = (Object *)0x0;
              }
              else {
                lVar24 = *(ushort *)(pOVar29 + lVar12 + lVar17) + uVar22;
                pOVar19 = pOVar29 + (ulong)*(uint *)(pOVar29 + lVar32 + lVar24) + lVar24 + lVar32;
              }
              if (((*(ushort *)(pOVar19 + -(long)*(int *)pOVar19) < 9) ||
                  ((ulong)*(ushort *)(pOVar19 + (8 - (long)*(int *)pOVar19)) == 0)) ||
                 (*(uint *)pSVar25 <=
                  *(uint *)(pOVar19 + *(ushort *)(pOVar19 + (8 - (long)*(int *)pOVar19))))) {
LAB_0014a317:
                __assert_fail("i < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                              ,0xc1,
                              "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
                             );
              }
              uVar31 = (ulong)(*(uint *)(pOVar19 +
                                        *(ushort *)(pOVar19 + (8 - (long)*(int *)pOVar19))) << 2);
              lVar24 = *(uint *)(pSVar25 + uVar31 + 4) + uVar31;
              pSVar26 = pSVar25 + lVar24 + 4;
              uVar23 = *(ushort *)(pSVar26 + -(long)*(int *)pSVar26);
              if (8 < uVar23) {
                lVar27 = -(long)*(int *)pSVar26;
                if (((ulong)*(ushort *)(pSVar25 + lVar27 + lVar24 + 0xc) != 0) &&
                   (pSVar26[*(ushort *)(pSVar25 + lVar27 + lVar24 + 0xc)].super_Table != (Table)0x0)
                   ) {
                  if (uVar23 < 0xb) {
                    iVar10 = 0;
LAB_0014a24f:
                    sVar28 = 0;
                  }
                  else {
                    if ((ulong)*(ushort *)(pSVar25 + lVar27 + lVar24 + 0xe) == 0) {
                      iVar10 = 0;
                    }
                    else {
                      iVar10 = *(int *)(pSVar26 + *(ushort *)(pSVar25 + lVar27 + lVar24 + 0xe));
                    }
                    if ((uVar23 < 0xd) ||
                       ((ulong)*(ushort *)(pSVar25 + lVar27 + lVar24 + 0x10) == 0))
                    goto LAB_0014a24f;
                    sVar28 = (size_t)*(int *)(pSVar26 +
                                             *(ushort *)(pSVar25 + lVar27 + lVar24 + 0x10));
                  }
                  anon_unknown_101::CopyInline
                            (local_90,(Field *)(pOVar29 + uVar22 + lVar32),table,(long)iVar10,sVar28
                            );
                  goto LAB_0014a20a;
                }
              }
            }
            else if (OVar5.super_Table != (Table)0x10) {
              uVar7 = (uint)(char)OVar5.super_Table;
              goto LAB_0014a0cd;
            }
          }
          if ((uVar15 < 0xb) || ((ulong)*(ushort *)(pOVar29 + lVar12 + 4 + lVar17) == 0)) {
            field = 0;
          }
          else {
            field = *(voffset_t *)
                     (pOVar29 + lVar32 + uVar22 + *(ushort *)(pOVar29 + lVar12 + 4 + lVar17));
          }
          FlatBufferBuilderImpl<false>::AddOffset<void>
                    (local_90,field,(Offset<void>)*(offset_type *)((long)local_68 + lVar16 * 4));
          lVar16 = lVar16 + 1;
        }
      }
LAB_0014a20a:
      lVar12 = lVar12 + 4;
      lVar17 = lVar32 + 4;
      lVar32 = lVar32 + 4;
    } while (pOVar29 + lVar17 != local_40 + (*(uint *)pOVar29 << 2));
  }
  if (lVar16 != (long)iStack_60._M_current - (long)local_68 >> 2) {
    __assert_fail("offset_idx == offsets.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/reflection.cpp"
                  ,0x2e6,
                  "Offset<const Table *> flatbuffers::CopyTable(FlatBufferBuilder &, const reflection::Schema &, const reflection::Object &, const Table &, bool)"
                 );
  }
  if (((*(ushort *)(objectdef + -(long)*(int *)objectdef) < 9) ||
      ((ulong)*(ushort *)(objectdef + (8 - (long)*(int *)objectdef)) == 0)) ||
     (objectdef[*(ushort *)(objectdef + (8 - (long)*(int *)objectdef))].super_Table == (Table)0x0))
  {
    uVar11 = FlatBufferBuilderImpl<false>::EndTable(local_90,local_a0);
  }
  else {
    uVar11 = (local_90->buf_).size_;
    ppuVar2 = &(local_90->buf_).scratch_;
    *ppuVar2 = *ppuVar2 + (ulong)local_90->num_field_loc * -8;
    local_90->num_field_loc = 0;
    local_90->max_voffset_ = 0;
  }
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return (Offset<const_flatbuffers::Table_*>)uVar11;
}

Assistant:

Offset<const Table *> CopyTable(FlatBufferBuilder &fbb,
                                const reflection::Schema &schema,
                                const reflection::Object &objectdef,
                                const Table &table, bool use_string_pooling) {
  // Before we can construct the table, we have to first generate any
  // subobjects, and collect their offsets.
  std::vector<uoffset_t> offsets;
  auto fielddefs = objectdef.fields();
  for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
    auto &fielddef = **it;
    // Skip if field is not present in the source.
    if (!table.CheckField(fielddef.offset())) continue;
    uoffset_t offset = 0;
    switch (fielddef.type()->base_type()) {
      case reflection::String: {
        offset = use_string_pooling
                     ? fbb.CreateSharedString(GetFieldS(table, fielddef)).o
                     : fbb.CreateString(GetFieldS(table, fielddef)).o;
        break;
      }
      case reflection::Obj: {
        auto &subobjectdef = *schema.objects()->Get(fielddef.type()->index());
        if (!subobjectdef.is_struct()) {
          offset = CopyTable(fbb, schema, subobjectdef,
                             *GetFieldT(table, fielddef), use_string_pooling)
                       .o;
        }
        break;
      }
      case reflection::Union: {
        auto &subobjectdef = GetUnionType(schema, objectdef, fielddef, table);
        offset = CopyTable(fbb, schema, subobjectdef,
                           *GetFieldT(table, fielddef), use_string_pooling)
                     .o;
        break;
      }
      case reflection::Vector: {
        auto vec =
            table.GetPointer<const Vector<Offset<Table>> *>(fielddef.offset());
        auto element_base_type = fielddef.type()->element();
        auto elemobjectdef =
            element_base_type == reflection::Obj
                ? schema.objects()->Get(fielddef.type()->index())
                : nullptr;
        switch (element_base_type) {
          case reflection::String: {
            std::vector<Offset<const String *>> elements(vec->size());
            auto vec_s = reinterpret_cast<const Vector<Offset<String>> *>(vec);
            for (uoffset_t i = 0; i < vec_s->size(); i++) {
              elements[i] = use_string_pooling
                                ? fbb.CreateSharedString(vec_s->Get(i)).o
                                : fbb.CreateString(vec_s->Get(i)).o;
            }
            offset = fbb.CreateVector(elements).o;
            break;
          }
          case reflection::Obj: {
            if (!elemobjectdef->is_struct()) {
              std::vector<Offset<const Table *>> elements(vec->size());
              for (uoffset_t i = 0; i < vec->size(); i++) {
                elements[i] = CopyTable(fbb, schema, *elemobjectdef,
                                        *vec->Get(i), use_string_pooling);
              }
              offset = fbb.CreateVector(elements).o;
              break;
            }
          }
            FLATBUFFERS_FALLTHROUGH();  // fall thru
          default: {                    // Scalars and structs.
            auto element_size = GetTypeSize(element_base_type);
            auto element_alignment = element_size;  // For primitive elements
            if (elemobjectdef && elemobjectdef->is_struct())
              element_size = elemobjectdef->bytesize();
            fbb.StartVector(vec->size(), element_size, element_alignment);
            fbb.PushBytes(vec->Data(), element_size * vec->size());
            offset = fbb.EndVector(vec->size());
            break;
          }
        }
        break;
      }
      default:  // Scalars.
        break;
    }
    if (offset) { offsets.push_back(offset); }
  }
  // Now we can build the actual table from either offsets or scalar data.
  auto start = objectdef.is_struct() ? fbb.StartStruct(objectdef.minalign())
                                     : fbb.StartTable();
  size_t offset_idx = 0;
  for (auto it = fielddefs->begin(); it != fielddefs->end(); ++it) {
    auto &fielddef = **it;
    if (!table.CheckField(fielddef.offset())) continue;
    auto base_type = fielddef.type()->base_type();
    switch (base_type) {
      case reflection::Obj: {
        auto &subobjectdef = *schema.objects()->Get(fielddef.type()->index());
        if (subobjectdef.is_struct()) {
          CopyInline(fbb, fielddef, table, subobjectdef.minalign(),
                     subobjectdef.bytesize());
          break;
        }
      }
        FLATBUFFERS_FALLTHROUGH();  // fall thru
      case reflection::Union:
      case reflection::String:
      case reflection::Vector:
        fbb.AddOffset(fielddef.offset(), Offset<void>(offsets[offset_idx++]));
        break;
      default: {  // Scalars.
        auto size = GetTypeSize(base_type);
        CopyInline(fbb, fielddef, table, size, size);
        break;
      }
    }
  }
  FLATBUFFERS_ASSERT(offset_idx == offsets.size());
  if (objectdef.is_struct()) {
    fbb.ClearOffsets();
    return fbb.EndStruct();
  } else {
    return fbb.EndTable(start);
  }
}